

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void crnlib::split_vectors<crnlib::vec<3u,float>>
               (vec<3U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<3U,_float> (*result) [2])

{
  double dVar1;
  vec<3U,_float> *pvVar2;
  row_vec *prVar3;
  float *pfVar4;
  vec<3U,_float> *in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  float total_variance;
  double right_dist2;
  double left_dist2;
  vec<3U,_float> *v_5;
  uint i_6;
  double right_ttsum;
  double left_ttsum;
  vec<3U,_float> new_right_child_1;
  vec<3U,_float> new_left_child_1;
  uint total_loops;
  uint cMaxLoops;
  float right_variance;
  float left_variance;
  float prev_total_variance;
  uint64 right_weight;
  uint64 left_weight;
  double t;
  float weight_1;
  vec<3U,_float> *v_4;
  uint i_5;
  double right_weight_1;
  double left_weight_1;
  vec<3U,_float> new_right_child;
  vec<3U,_float> new_left_child;
  uint j;
  double sum;
  uint i_4;
  double max_sum;
  vec<3U,_float> x_2;
  uint iter;
  vec<3U,_float> axis;
  uint y_1;
  uint x_1;
  float divider;
  uint y;
  uint x;
  vec<3U,_float> w;
  vec<3U,_float> *v_3;
  uint i_3;
  matrix<3U,_3U,_float> covar;
  uint N;
  vec<3U,_float> right_child;
  vec<3U,_float> left_child;
  double dist_1;
  vec<3U,_float> *v_2;
  uint i_2;
  double opposite_dist;
  vec<3U,_float> opposite;
  double dist;
  vec<3U,_float> *v_1;
  uint i_1;
  double furthest_dist;
  vec<3U,_float> furthest;
  float variance;
  uint weight;
  vec<3U,_float> *v;
  uint i;
  double ttsum;
  uint64 total_weight;
  vec<3U,_float> centroid;
  double weightedDotProducts [64];
  vec<3U,_float> weightedVectors [64];
  undefined4 in_stack_fffffffffffff7b8;
  float in_stack_fffffffffffff7bc;
  float in_stack_fffffffffffff7c0;
  float in_stack_fffffffffffff7c4;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7cc;
  matrix<3U,_3U,_float> *in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7dc;
  float local_81c;
  float local_7fc;
  double local_7f8;
  float local_7d8;
  float local_7bc;
  float local_7a4;
  vec<3U,_float> *local_788;
  uint local_75c;
  double local_758;
  double local_750;
  vec<3U,_float> local_744;
  vec<3U,_float> local_738;
  uint local_72c;
  undefined4 local_728;
  float local_724;
  float local_720;
  float local_71c;
  ulong local_718;
  ulong local_710;
  vec<3U,_float> local_704;
  vec<3U,_float> local_6f8;
  vec<3U,_float> local_6ec;
  double local_6e0;
  float local_6d4;
  long local_6d0;
  uint local_6c4;
  double local_6c0;
  double local_6b8;
  vec<3U,_float> local_6ac;
  vec<3U,_float> local_6a0;
  uint local_694;
  double local_690;
  uint local_684;
  double local_680;
  vec<3U,_float> local_678;
  uint local_66c;
  vec<3U,_float> local_668;
  uint local_65c;
  uint local_658;
  float local_654;
  uint local_650;
  uint local_64c;
  vec<3U,_float> local_648;
  vec<3U,_float> local_63c;
  vec<3U,_float> *local_630;
  uint local_624;
  matrix<3U,_3U,_float> local_620;
  undefined4 local_5fc;
  vec<3U,_float> local_5ec [2];
  vec<3U,_float> local_5d4;
  double local_5c8;
  vec<3U,_float> *local_5c0;
  uint local_5b4;
  double local_5b0;
  vec<3U,_float> local_5a4;
  double local_598;
  vec<3U,_float> *local_590;
  uint local_584;
  double local_580;
  vec<3U,_float> local_578;
  float local_56c;
  vec<3U,_float> local_568;
  uint local_55c;
  long local_558;
  uint local_54c;
  double local_548;
  ulong local_540;
  vec<3U,_float> local_534;
  double adStack_528 [64];
  vec<3U,_float> local_328 [64];
  undefined1 auStack_28 [20];
  uint local_14;
  long local_10;
  long local_8;
  
  local_788 = local_328;
  auStack_28._8_8_ = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    vec<3U,_float>::vec(local_788);
    local_788 = local_788 + 1;
  } while (local_788 != (vec<3U,_float> *)auStack_28);
  vec<3U,_float>::vec((vec<3U,_float> *)
                      CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                      (eClear)in_stack_fffffffffffff7bc);
  local_540 = 0;
  local_548 = 0.0;
  for (local_54c = 0; dVar1 = local_548, local_54c < local_14; local_54c = local_54c + 1) {
    local_558 = local_8 + (ulong)local_54c * 0xc;
    local_55c = *(uint *)(local_10 + (ulong)local_54c * 4);
    operator*((vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
              in_stack_fffffffffffff7c4);
    vec<3U,_float>::operator=(local_328 + local_54c,&local_568);
    vec<3U,_float>::operator+=(&local_534,local_328 + local_54c);
    local_540 = local_540 + local_55c;
    fVar5 = vec<3U,_float>::dot((vec<3U,_float> *)
                                CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                                (vec<3U,_float> *)
                                CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
    adStack_528[local_54c] = (double)(fVar5 * (float)local_55c);
    local_548 = adStack_528[local_54c] + local_548;
  }
  fVar5 = vec<3U,_float>::dot((vec<3U,_float> *)
                              CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                              (vec<3U,_float> *)
                              CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  local_7a4 = (float)local_540;
  local_56c = (float)(dVar1 - (double)(fVar5 / local_7a4));
  local_7bc = (float)local_540;
  vec<3U,_float>::operator*=(&local_534,1.0 / local_7bc);
  pvVar2 = vec<3U,_float>::operator=((vec<3U,_float> *)(auStack_28._8_8_ + 0xc),&local_534);
  vec<3U,_float>::operator=((vec<3U,_float> *)auStack_28._8_8_,pvVar2);
  if ((0.0 < local_56c) && (local_14 != 1)) {
    vec<3U,_float>::vec(&local_578);
    local_580 = -1.0;
    for (local_584 = 0; local_584 < local_14; local_584 = local_584 + 1) {
      local_590 = (vec<3U,_float> *)(local_8 + (ulong)local_584 * 0xc);
      fVar5 = vec<3U,_float>::squared_distance(local_590,&local_534);
      local_598 = (double)fVar5;
      if (local_580 < local_598) {
        local_580 = local_598;
        vec<3U,_float>::operator=(&local_578,local_590);
      }
    }
    vec<3U,_float>::vec(&local_5a4);
    local_5b0 = -1.0;
    for (local_5b4 = 0; local_5b4 < local_14; local_5b4 = local_5b4 + 1) {
      local_5c0 = (vec<3U,_float> *)(local_8 + (ulong)local_5b4 * 0xc);
      fVar5 = vec<3U,_float>::squared_distance(local_5c0,&local_578);
      local_5c8 = (double)fVar5;
      if (local_5b0 < local_5c8) {
        local_5b0 = local_5c8;
        vec<3U,_float>::operator=(&local_5a4,local_5c0);
      }
    }
    operator+((vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
              in_stack_fffffffffffff7d0->m_rows);
    operator*((vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
              in_stack_fffffffffffff7c4);
    operator+((vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
              in_stack_fffffffffffff7d0->m_rows);
    operator*((vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
              in_stack_fffffffffffff7c4);
    if (2 < local_14) {
      local_5fc = 3;
      matrix<3U,_3U,_float>::matrix(in_stack_fffffffffffff7d0);
      matrix<3U,_3U,_float>::clear
                ((matrix<3U,_3U,_float> *)
                 CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
      for (local_624 = 0; local_624 < local_14; local_624 = local_624 + 1) {
        operator-((vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                  in_stack_fffffffffffff7d0->m_rows);
        local_630 = &local_63c;
        operator*((vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                  in_stack_fffffffffffff7c4);
        for (local_64c = 0; local_64c < 3; local_64c = local_64c + 1) {
          for (local_650 = local_64c; local_650 < 3; local_650 = local_650 + 1) {
            prVar3 = matrix<3U,_3U,_float>::operator[](&local_620,local_64c);
            pfVar4 = vec<3U,_float>::operator[](prVar3,local_650);
            fVar5 = *pfVar4;
            fVar6 = vec<3U,_float>::operator[](local_630,local_64c);
            fVar7 = vec<3U,_float>::operator[](&local_648,local_650);
            prVar3 = matrix<3U,_3U,_float>::operator[](&local_620,local_64c);
            pfVar4 = vec<3U,_float>::operator[](prVar3,local_650);
            *pfVar4 = fVar5 + fVar6 * fVar7;
          }
        }
      }
      local_7d8 = (float)local_540;
      local_654 = local_7d8;
      for (local_658 = 0; local_658 < 3; local_658 = local_658 + 1) {
        for (local_65c = local_658; fVar5 = local_654, local_65c < 3; local_65c = local_65c + 1) {
          prVar3 = matrix<3U,_3U,_float>::operator[](&local_620,local_658);
          pfVar4 = vec<3U,_float>::operator[](prVar3,local_65c);
          *pfVar4 = *pfVar4 / fVar5;
          prVar3 = matrix<3U,_3U,_float>::operator[](&local_620,local_658);
          pfVar4 = vec<3U,_float>::operator[](prVar3,local_65c);
          fVar5 = *pfVar4;
          prVar3 = matrix<3U,_3U,_float>::operator[](&local_620,local_65c);
          pfVar4 = vec<3U,_float>::operator[](prVar3,local_658);
          *pfVar4 = fVar5;
        }
      }
      vec<3U,_float>::vec((vec<3U,_float> *)
                          CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                          in_stack_fffffffffffff7bc);
      for (local_66c = 0; local_66c < 10; local_66c = local_66c + 1) {
        vec<3U,_float>::vec(&local_678);
        local_680 = 0.0;
        for (local_684 = 0; local_684 < 3; local_684 = local_684 + 1) {
          local_690 = 0.0;
          for (local_694 = 0; local_694 < 3; local_694 = local_694 + 1) {
            pfVar4 = vec<3U,_float>::operator[](&local_668,local_694);
            fVar5 = *pfVar4;
            prVar3 = matrix<3U,_3U,_float>::operator[](&local_620,local_684);
            pfVar4 = vec<3U,_float>::operator[](prVar3,local_694);
            local_690 = (double)(fVar5 * *pfVar4) + local_690;
          }
          fVar5 = (float)local_690;
          pfVar4 = vec<3U,_float>::operator[](&local_678,local_684);
          *pfVar4 = fVar5;
          if (local_684 == 0) {
            local_7f8 = local_690;
          }
          else {
            local_7f8 = math::maximum<double>(local_680,local_690);
          }
          local_680 = local_7f8;
        }
        if ((local_680 != 0.0) || (NAN(local_680))) {
          vec<3U,_float>::operator*=(&local_678,(float)(1.0 / local_680));
        }
        vec<3U,_float>::operator=(&local_668,&local_678);
      }
      vec<3U,_float>::normalize
                (in_stack_fffffffffffff7d0->m_rows,
                 (vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      vec<3U,_float>::vec((vec<3U,_float> *)
                          CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                          in_stack_fffffffffffff7bc);
      vec<3U,_float>::vec((vec<3U,_float> *)
                          CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                          in_stack_fffffffffffff7bc);
      local_6b8 = 0.0;
      local_6c0 = 0.0;
      for (local_6c4 = 0; local_6c4 < local_14; local_6c4 = local_6c4 + 1) {
        local_6d0 = local_8 + (ulong)local_6c4 * 0xc;
        local_6d4 = (float)*(uint *)(local_10 + (ulong)local_6c4 * 4);
        operator-((vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                  in_stack_fffffffffffff7d0->m_rows);
        fVar5 = operator*(&local_6ec,&local_668);
        local_6e0 = (double)fVar5;
        if (0.0 <= local_6e0) {
          vec<3U,_float>::operator+=(&local_6ac,local_328 + local_6c4);
          local_6c0 = (double)local_6d4 + local_6c0;
        }
        else {
          vec<3U,_float>::operator+=(&local_6a0,local_328 + local_6c4);
          local_6b8 = (double)local_6d4 + local_6b8;
        }
      }
      if ((0.0 < local_6b8) && (0.0 < local_6c0)) {
        operator*((vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                  in_stack_fffffffffffff7c4);
        vec<3U,_float>::operator=(&local_5d4,&local_6f8);
        operator*((vec<3U,_float> *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                  in_stack_fffffffffffff7c4);
        vec<3U,_float>::operator=(local_5ec,&local_704);
      }
    }
    local_710 = 0;
    local_718 = 0;
    local_71c = 1e+10;
    local_720 = 0.0;
    local_724 = 0.0;
    local_728 = 0x400;
    for (local_72c = 0; local_72c < 0x400; local_72c = local_72c + 1) {
      vec<3U,_float>::vec((vec<3U,_float> *)
                          CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                          (eClear)in_stack_fffffffffffff7bc);
      vec<3U,_float>::vec((vec<3U,_float> *)
                          CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                          (eClear)in_stack_fffffffffffff7bc);
      local_750 = 0.0;
      local_758 = 0.0;
      local_710 = 0;
      local_718 = 0;
      for (local_75c = 0; local_75c < local_14; local_75c = local_75c + 1) {
        pvVar2 = (vec<3U,_float> *)(local_8 + (ulong)local_75c * 0xc);
        fVar5 = vec<3U,_float>::squared_distance(&local_5d4,pvVar2);
        fVar6 = vec<3U,_float>::squared_distance(local_5ec,pvVar2);
        if (fVar6 <= fVar5) {
          vec<3U,_float>::operator+=(&local_744,local_328 + local_75c);
          local_758 = adStack_528[local_75c] + local_758;
          local_718 = *(uint *)(local_10 + (ulong)local_75c * 4) + local_718;
        }
        else {
          vec<3U,_float>::operator+=(&local_738,local_328 + local_75c);
          local_750 = adStack_528[local_75c] + local_750;
          local_710 = *(uint *)(local_10 + (ulong)local_75c * 4) + local_710;
        }
      }
      if (local_710 == 0) {
        return;
      }
      if (local_718 == 0) {
        return;
      }
      fVar5 = vec<3U,_float>::dot((vec<3U,_float> *)
                                  CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                                  (vec<3U,_float> *)
                                  CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
      local_7fc = (float)local_710;
      local_720 = (float)(local_750 - (double)(fVar5 / local_7fc));
      fVar5 = vec<3U,_float>::dot((vec<3U,_float> *)
                                  CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                                  (vec<3U,_float> *)
                                  CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
      local_81c = (float)local_718;
      local_724 = (float)(local_758 - (double)(fVar5 / local_81c));
      vec<3U,_float>::operator*=(&local_738,1.0 / (float)local_710);
      in_stack_fffffffffffff7c0 = (float)(long)local_718;
      in_stack_fffffffffffff7c4 = (float)local_718;
      vec<3U,_float>::operator*=(&local_744,1.0 / in_stack_fffffffffffff7c4);
      vec<3U,_float>::operator=(&local_5d4,&local_738);
      vec<3U,_float>::operator=(local_5ec,&local_744);
      fVar5 = local_720 + local_724;
      if ((fVar5 < 1e-05) || ((local_71c - fVar5) / fVar5 < 1e-05)) break;
      local_71c = fVar5;
    }
    vec<3U,_float>::operator=((vec<3U,_float> *)auStack_28._8_8_,&local_5d4);
    vec<3U,_float>::operator=((vec<3U,_float> *)(auStack_28._8_8_ + 0xc),local_5ec);
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2]) {
  VectorType weightedVectors[64];
  double weightedDotProducts[64];
  VectorType centroid(cClear);
  uint64 total_weight = 0;
  double ttsum = 0.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    const uint weight = weights[i];
    weightedVectors[i] = v * (float)weight;
    centroid += weightedVectors[i];
    total_weight += weight;
    weightedDotProducts[i] = v.dot(v) * weight;
    ttsum += weightedDotProducts[i];
  }
  float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
  centroid *= (1.0f / total_weight);
  result[0] = result[1] = centroid;
  if (variance <= 0.0f || size == 1)
    return;
  VectorType furthest;
  double furthest_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(centroid);
    if (dist > furthest_dist) {
      furthest_dist = dist;
      furthest = v;
    }
  }
  VectorType opposite;
  double opposite_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(furthest);
    if (dist > opposite_dist) {
      opposite_dist = dist;
      opposite = v;
    }
  }
  VectorType left_child((furthest + centroid) * .5f);
  VectorType right_child((opposite + centroid) * .5f);
  if (size > 2) {
    const uint N = VectorType::num_elements;
    matrix<N, N, float> covar;
    covar.clear();
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i] - centroid;
      const VectorType w = v * (float)weights[i];
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
      }
    }
    float divider = (float)total_weight;
    for (uint x = 0; x < N; x++) {
      for (uint y = x; y < N; y++) {
        covar[x][y] /= divider;
        covar[y][x] = covar[x][y];
      }
    }
    VectorType axis(1.0f);
    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;
      double max_sum = 0;
      for (uint i = 0; i < N; i++) {
        double sum = 0;
        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];
        x[i] = (float)sum;
        max_sum = i ? math::maximum(max_sum, sum) : sum;
      }
      if (max_sum != 0.0f)
        x *= (float)(1.0f / max_sum);
      axis = x;
    }
    axis.normalize();
    VectorType new_left_child(0.0f);
    VectorType new_right_child(0.0f);
    double left_weight = 0.0f;
    double right_weight = 0.0f;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      const float weight = (float)weights[i];
      double t = (v - centroid) * axis;
      if (t < 0.0f) {
        new_left_child += weightedVectors[i];
        left_weight += weight;
      } else {
        new_right_child += weightedVectors[i];
        right_weight += weight;
      }
    }
    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child = new_left_child * (float)(1.0f / left_weight);
      right_child = new_right_child * (float)(1.0f / right_weight);
    }
  }
  uint64 left_weight = 0;
  uint64 right_weight = 0;
  float prev_total_variance = 1e+10f;
  float left_variance = 0.0f;
  float right_variance = 0.0f;
  const uint cMaxLoops = 1024;
  for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
    VectorType new_left_child(cClear);
    VectorType new_right_child(cClear);
    double left_ttsum = 0.0f;
    double right_ttsum = 0.0f;
    left_weight = 0;
    right_weight = 0;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      if (left_dist2 < right_dist2) {
        new_left_child += weightedVectors[i];
        left_ttsum += weightedDotProducts[i];
        left_weight += weights[i];
      } else {
        new_right_child += weightedVectors[i];
        right_ttsum += weightedDotProducts[i];
        right_weight += weights[i];
      }
    }
    if ((!left_weight) || (!right_weight))
      return;
    left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
    right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
    new_left_child *= (1.0f / left_weight);
    new_right_child *= (1.0f / right_weight);
    left_child = new_left_child;
    right_child = new_right_child;
    float total_variance = left_variance + right_variance;
    if (total_variance < .00001f)
      break;
    if (((prev_total_variance - total_variance) / total_variance) < .00001f)
      break;
    prev_total_variance = total_variance;
  }
  result[0] = left_child;
  result[1] = right_child;
}